

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

bool __thiscall ConditionalExecution::testIBlock(ConditionalExecution *this)

{
  int4 iVar1;
  int iVar2;
  OpCode OVar3;
  undefined4 extraout_var;
  ConditionalExecution *this_local;
  
  iVar1 = FlowBlock::sizeIn(&this->iblock->super_FlowBlock);
  if (iVar1 == 2) {
    iVar1 = FlowBlock::sizeOut(&this->iblock->super_FlowBlock);
    if (iVar1 == 2) {
      iVar2 = (*(this->iblock->super_FlowBlock)._vptr_FlowBlock[0xe])();
      this->cbranch = (PcodeOp *)CONCAT44(extraout_var,iVar2);
      if (this->cbranch == (PcodeOp *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        OVar3 = PcodeOp::code(this->cbranch);
        if (OVar3 == CPUI_CBRANCH) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConditionalExecution::testIBlock(void)

{
  if (iblock->sizeIn() != 2) return false;
  if (iblock->sizeOut() != 2) return false;
  cbranch = iblock->lastOp();
  if (cbranch == (PcodeOp *)0) return false;
  if (cbranch->code() != CPUI_CBRANCH) return false;
  return true;
}